

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::MethodDescriptorProto::ByteSizeLong(MethodDescriptorProto *this)

{
  uint uVar1;
  type_conflict2 tVar2;
  uint32_t *puVar3;
  string *psVar4;
  size_t sVar5;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  MethodDescriptorProto *this_;
  MethodDescriptorProto *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  tVar2 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x30);
  sStack_58 = (size_t)(tVar2 << 1);
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar4 = _internal_name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      psVar4 = _internal_input_type_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      psVar4 = _internal_output_type_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::MethodOptions>
                        ((this->field_0)._impl_.options_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t MethodDescriptorProto::ByteSizeLong() const {
  const MethodDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x00000030u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional string input_type = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_input_type());
    }
    // optional string output_type = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_output_type());
    }
    // optional .google.protobuf.MethodOptions options = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}